

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::InternalSwap
          (KNearestNeighborsClassifier *this,KNearestNeighborsClassifier *other)

{
  KNearestNeighborsClassifier *other_local;
  KNearestNeighborsClassifier *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::memswap<16>
            ((char *)&this->nearestneighborsindex_,(char *)&other->nearestneighborsindex_);
  std::swap<CoreML::Specification::KNearestNeighborsClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<CoreML::Specification::KNearestNeighborsClassifier::DefaultClassLabelUnion>
            (&this->DefaultClassLabel_,&other->DefaultClassLabel_);
  std::swap<CoreML::Specification::KNearestNeighborsClassifier::WeightingSchemeUnion>
            (&this->WeightingScheme_,&other->WeightingScheme_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  std::swap<unsigned_int>(this->_oneof_case_ + 2,other->_oneof_case_ + 2);
  return;
}

Assistant:

void KNearestNeighborsClassifier::InternalSwap(KNearestNeighborsClassifier* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(KNearestNeighborsClassifier, numberofneighbors_)
      + sizeof(KNearestNeighborsClassifier::numberofneighbors_)
      - PROTOBUF_FIELD_OFFSET(KNearestNeighborsClassifier, nearestneighborsindex_)>(
          reinterpret_cast<char*>(&nearestneighborsindex_),
          reinterpret_cast<char*>(&other->nearestneighborsindex_));
  swap(ClassLabels_, other->ClassLabels_);
  swap(DefaultClassLabel_, other->DefaultClassLabel_);
  swap(WeightingScheme_, other->WeightingScheme_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
  swap(_oneof_case_[1], other->_oneof_case_[1]);
  swap(_oneof_case_[2], other->_oneof_case_[2]);
}